

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rANS_static.c
# Opt level: O1

uchar * rans_uncompress_O1(uchar *in,uint in_size,uint *out_size)

{
  byte *pbVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  uint8_t *ptr;
  uchar *puVar7;
  long lVar8;
  long lVar9;
  void *pvVar10;
  uint *puVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  uint *puVar25;
  ulong uVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  ulong uVar30;
  bool bVar31;
  RansDecSymbol syms [256] [256];
  ari_decoder D [256];
  ushort auStack_c0838 [131072];
  uint auStack_80838 [512];
  long alStack_80038 [65537];
  
  memset(auStack_80838,0,0x80800);
  if ((*in == '\x01') && (*(int *)(in + 1) == in_size - 9)) {
    uVar6 = *(uint *)(in + 5);
    puVar7 = (uchar *)malloc((long)(int)uVar6);
    uVar13 = 0;
    if (puVar7 != (uchar *)0x0) {
      uVar12 = (uint)in[9];
      puVar25 = (uint *)(in + 10);
      do {
        uVar16 = (uint)(byte)*puVar25;
        puVar25 = (uint *)((long)puVar25 + 1);
        lVar8 = (long)(int)uVar12;
        uVar29 = 0;
        uVar14 = 0;
        do {
          bVar2 = (byte)*puVar25;
          lVar9 = (long)(int)uVar16;
          auStack_80838[lVar8 * 0x202 + lVar9 * 2] = (uint)bVar2;
          if ((char)bVar2 < '\0') {
            uVar18 = bVar2 & 0x7f;
            auStack_80838[lVar8 * 0x202 + lVar9 * 2] = uVar18;
            pbVar1 = (byte *)((long)puVar25 + 1);
            puVar25 = (uint *)((long)puVar25 + 2);
            auStack_80838[lVar8 * 0x202 + lVar9 * 2] = (uint)*pbVar1 | uVar18 << 8;
          }
          else {
            puVar25 = (uint *)((long)puVar25 + 1);
          }
          uVar28 = (uint)uVar14;
          auStack_80838[lVar8 * 0x202 + lVar9 * 2 + 1] = uVar28;
          uVar18 = auStack_80838[lVar8 * 0x202 + lVar9 * 2];
          if (uVar18 == 0) {
            uVar18 = 0x1000;
          }
          auStack_80838[lVar8 * 0x202 + lVar9 * 2] = uVar18;
          if (0x10000 < uVar28) {
            __assert_fail("start <= (1 << 16)",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                          ,0x103,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
          }
          if (0x10000 - uVar28 < uVar18) {
            __assert_fail("freq <= (1 << 16) - start",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_byte.h"
                          ,0x104,"void RansDecSymbolInit(RansDecSymbol *, uint32_t, uint32_t)");
          }
          auStack_c0838[lVar8 * 0x200 + lVar9 * 2] = (ushort)uVar14;
          (auStack_c0838 + lVar8 * 0x200 + lVar9 * 2)[1] = (ushort)uVar18;
          if (alStack_80038[lVar8 * 0x101] == 0) {
            pvVar10 = malloc(0x1000);
            alStack_80038[lVar8 * 0x101] = (long)pvVar10;
          }
          memset((void *)(uVar14 + alStack_80038[lVar8 * 0x101]),uVar16,(long)(int)uVar18);
          uVar14 = (ulong)(uVar18 + uVar28);
          if (0x1000 < (int)(uVar18 + uVar28)) {
            __assert_fail("x <= TOTFREQ",
                          "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/cram/rANS_static.c"
                          ,0x25c,
                          "unsigned char *rans_uncompress_O1(unsigned char *, unsigned int, unsigned int *)"
                         );
          }
          if (uVar29 == 0) {
            uVar29 = uVar16 + 1;
            uVar16 = (uint)(byte)*puVar25;
            if (uVar29 == uVar16) {
              uVar29 = (uint)*(byte *)((long)puVar25 + 1);
              puVar25 = (uint *)((long)puVar25 + 2);
            }
            else {
              puVar25 = (uint *)((long)puVar25 + 1);
              uVar29 = 0;
            }
          }
          else {
            uVar29 = uVar29 - 1;
            uVar16 = uVar16 + 1;
          }
        } while (uVar16 != 0);
        if (uVar13 == 0) {
          uVar13 = uVar12 + 1;
          uVar12 = (uint)(byte)*puVar25;
          if (uVar13 == uVar12) {
            uVar13 = (uint)*(byte *)((long)puVar25 + 1);
            puVar25 = (uint *)((long)puVar25 + 2);
          }
          else {
            puVar25 = (uint *)((long)puVar25 + 1);
            uVar13 = 0;
          }
        }
        else {
          uVar13 = uVar13 - 1;
          uVar12 = uVar12 + 1;
        }
        if (uVar12 == 0) {
          uVar13 = puVar25[3];
          puVar11 = puVar25 + 4;
          uVar12 = (int)uVar6 >> 2;
          uVar14 = (ulong)(uVar12 * 3);
          if ((int)uVar12 < 1) {
            uVar24 = 0;
          }
          else {
            uVar16 = puVar25[2];
            uVar29 = *puVar25;
            uVar18 = puVar25[1];
            uVar17 = (ulong)(uVar12 * 2);
            uVar14 = (ulong)(uVar12 * 3);
            uVar21 = 0;
            uVar15 = 0;
            uVar19 = (ulong)uVar12;
            uVar20 = 0;
            uVar22 = 0;
            uVar30 = 0;
            do {
              bVar2 = *(byte *)(alStack_80038[uVar15 * 0x101] + (ulong)(uVar29 & 0xfff));
              uVar23 = (ulong)bVar2;
              bVar3 = *(byte *)(alStack_80038[uVar30 * 0x101] + (ulong)(uVar18 & 0xfff));
              uVar26 = (ulong)bVar3;
              bVar4 = *(byte *)(alStack_80038[uVar20 * 0x101] + (ulong)(uVar16 & 0xfff));
              uVar27 = (ulong)bVar4;
              uVar29 = ((uVar29 & 0xfff) - (uint)auStack_c0838[uVar15 * 0x200 + uVar23 * 2]) +
                       (uVar29 >> 0xc) * (uint)auStack_c0838[uVar15 * 0x200 + uVar23 * 2 + 1];
              bVar5 = *(byte *)(alStack_80038[uVar22 * 0x101] + (ulong)(uVar13 & 0xfff));
              uVar24 = (ulong)bVar5;
              puVar7[uVar21] = bVar2;
              puVar7[uVar19] = bVar3;
              puVar7[uVar17] = bVar4;
              puVar7[uVar14] = bVar5;
              uVar28 = uVar29;
              if (uVar29 < 0x800000) {
                do {
                  uVar29 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar29 = (uint)(byte)uVar29 | uVar28 << 8;
                  bVar31 = uVar28 < 0x8000;
                  uVar28 = uVar29;
                } while (bVar31);
              }
              uVar18 = ((uVar18 & 0xfff) - (uint)auStack_c0838[uVar30 * 0x200 + uVar26 * 2]) +
                       (uVar18 >> 0xc) * (uint)auStack_c0838[uVar30 * 0x200 + uVar26 * 2 + 1];
              uVar28 = uVar18;
              if (uVar18 < 0x800000) {
                do {
                  uVar18 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar18 = (uint)(byte)uVar18 | uVar28 << 8;
                  bVar31 = uVar28 < 0x8000;
                  uVar28 = uVar18;
                } while (bVar31);
              }
              uVar16 = ((uVar16 & 0xfff) - (uint)auStack_c0838[uVar20 * 0x200 + uVar27 * 2]) +
                       (uVar16 >> 0xc) * (uint)auStack_c0838[uVar20 * 0x200 + uVar27 * 2 + 1];
              uVar28 = uVar16;
              if (uVar16 < 0x800000) {
                do {
                  uVar16 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar16 = (uint)(byte)uVar16 | uVar28 << 8;
                  bVar31 = uVar28 < 0x8000;
                  uVar28 = uVar16;
                } while (bVar31);
              }
              uVar13 = ((uVar13 & 0xfff) - (uint)auStack_c0838[uVar22 * 0x200 + uVar24 * 2]) +
                       (uVar13 >> 0xc) * (uint)auStack_c0838[uVar22 * 0x200 + uVar24 * 2 + 1];
              uVar28 = uVar13;
              if (uVar13 < 0x800000) {
                do {
                  uVar13 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar13 = (uint)(byte)uVar13 | uVar28 << 8;
                  bVar31 = uVar28 < 0x8000;
                  uVar28 = uVar13;
                } while (bVar31);
              }
              uVar21 = uVar21 + 1;
              uVar19 = uVar19 + 1;
              uVar17 = uVar17 + 1;
              uVar14 = uVar14 + 1;
              uVar15 = uVar23;
              uVar20 = uVar27;
              uVar22 = uVar24;
              uVar30 = uVar26;
            } while (uVar21 != uVar12);
          }
          if ((int)uVar14 < (int)uVar6) {
            lVar8 = (long)(int)uVar14;
            do {
              bVar2 = *(byte *)(alStack_80038[uVar24 * 0x101] + (ulong)(uVar13 & 0xfff));
              uVar14 = (ulong)bVar2;
              puVar7[lVar8] = bVar2;
              uVar13 = ((uVar13 & 0xfff) - (uint)auStack_c0838[uVar24 * 0x200 + uVar14 * 2]) +
                       (uVar13 >> 0xc) * (uint)auStack_c0838[uVar24 * 0x200 + uVar14 * 2 + 1];
              uVar12 = uVar13;
              if (uVar13 < 0x800000) {
                do {
                  uVar13 = *puVar11;
                  puVar11 = (uint *)((long)puVar11 + 1);
                  uVar13 = (uint)(byte)uVar13 | uVar12 << 8;
                  bVar31 = uVar12 < 0x8000;
                  uVar12 = uVar13;
                } while (bVar31);
              }
              lVar8 = lVar8 + 1;
              uVar24 = uVar14;
            } while (lVar8 < (int)uVar6);
          }
          *out_size = uVar6;
          lVar8 = 0x800;
          do {
            if (*(void **)((long)auStack_80838 + lVar8) != (void *)0x0) {
              free(*(void **)((long)auStack_80838 + lVar8));
            }
            lVar8 = lVar8 + 0x808;
          } while (lVar8 != 0x81000);
          return puVar7;
        }
      } while( true );
    }
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *rans_uncompress_O1(unsigned char *in, unsigned int in_size,
				  unsigned int *out_size) {
    /* Load in the static tables */
    unsigned char *cp = in + 9;
    int i, j = -999, x, out_sz, in_sz, rle_i, rle_j;
    char *out_buf;
    ari_decoder D[256];
    RansDecSymbol syms[256][256];

    memset(D, 0, 256*sizeof(*D));

    if (*in++ != 1) // Order-1 check
	return NULL;

    in_sz  = ((in[0])<<0) | ((in[1])<<8) | ((in[2])<<16) | ((in[3])<<24);
    out_sz = ((in[4])<<0) | ((in[5])<<8) | ((in[6])<<16) | ((in[7])<<24);
    if (in_sz != in_size-9)
	return NULL;

    out_buf = malloc(out_sz);
    if (!out_buf)
	return NULL;

    //fprintf(stderr, "out_sz=%d\n", out_sz);

    //i = *cp++;
    rle_i = 0;
    i = *cp++;
    do {
	rle_j = x = 0;
	j = *cp++;
	do {
	    if ((D[i].fc[j].F = *cp++) >= 128) {
		D[i].fc[j].F &= ~128;
		D[i].fc[j].F = ((D[i].fc[j].F & 127) << 8) | *cp++;
	    }
	    D[i].fc[j].C = x;

	    //fprintf(stderr, "i=%d j=%d F=%d C=%d\n", i, j, D[i].fc[j].F, D[i].fc[j].C);

	    if (!D[i].fc[j].F)
		D[i].fc[j].F = TOTFREQ;

	    RansDecSymbolInit(&syms[i][j], D[i].fc[j].C, D[i].fc[j].F);

	    /* Build reverse lookup table */
	    if (!D[i].R) D[i].R = (unsigned char *)malloc(TOTFREQ);
	    memset(&D[i].R[x], j, D[i].fc[j].F);

	    x += D[i].fc[j].F;
	    assert(x <= TOTFREQ);

	    if (!rle_j && j+1 == *cp) {
		j = *cp++;
		rle_j = *cp++;
	    } else if (rle_j) {
		rle_j--;
		j++;
	    } else {
		j = *cp++;
	    }
	} while(j);

	if (!rle_i && i+1 == *cp) {
	    i = *cp++;
	    rle_i = *cp++;
	} else if (rle_i) {
	    rle_i--;
	    i++;
	} else {
	    i = *cp++;
	}
    } while (i);

    // Precompute reverse lookup of frequency.

    RansState rans0, rans1, rans2, rans3;
    uint8_t *ptr = cp;
    RansDecInit(&rans0, &ptr);
    RansDecInit(&rans1, &ptr);
    RansDecInit(&rans2, &ptr);
    RansDecInit(&rans3, &ptr);

    int isz4 = out_sz>>2;
    int l0 = 0;
    int l1 = 0;
    int l2 = 0;
    int l3 = 0;
    int i4[] = {0*isz4, 1*isz4, 2*isz4, 3*isz4};

    RansState R[4];
    R[0] = rans0;
    R[1] = rans1;
    R[2] = rans2;
    R[3] = rans3;

    for (; i4[0] < isz4; i4[0]++, i4[1]++, i4[2]++, i4[3]++) {
	uint32_t m[4] = {R[0] & ((1u << TF_SHIFT)-1),
			 R[1] & ((1u << TF_SHIFT)-1),
			 R[2] & ((1u << TF_SHIFT)-1),
			 R[3] & ((1u << TF_SHIFT)-1)};

	uint8_t c[4] = {D[l0].R[m[0]],
			D[l1].R[m[1]],
			D[l2].R[m[2]],
			D[l3].R[m[3]]};

	out_buf[i4[0]] = c[0];
	out_buf[i4[1]] = c[1];
	out_buf[i4[2]] = c[2];
	out_buf[i4[3]] = c[3];

	//RansDecAdvanceSymbolStep(&R[0], &syms[l0][c[0]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[1], &syms[l1][c[1]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[2], &syms[l2][c[2]], TF_SHIFT);
	//RansDecAdvanceSymbolStep(&R[3], &syms[l3][c[3]], TF_SHIFT);

	R[0] = syms[l0][c[0]].freq * (R[0]>>TF_SHIFT);
	R[1] = syms[l1][c[1]].freq * (R[1]>>TF_SHIFT);
	R[2] = syms[l2][c[2]].freq * (R[2]>>TF_SHIFT);
	R[3] = syms[l3][c[3]].freq * (R[3]>>TF_SHIFT);

	R[0] += m[0] - syms[l0][c[0]].start;
	R[1] += m[1] - syms[l1][c[1]].start;
	R[2] += m[2] - syms[l2][c[2]].start;
	R[3] += m[3] - syms[l3][c[3]].start;

	RansDecRenorm(&R[0], &ptr);
	RansDecRenorm(&R[1], &ptr);
	RansDecRenorm(&R[2], &ptr);
	RansDecRenorm(&R[3], &ptr);

	l0 = c[0];
	l1 = c[1];
	l2 = c[2];
	l3 = c[3];
    }

    rans0 = R[0];
    rans1 = R[1];
    rans2 = R[2];
    rans3 = R[3];

    // Remainder
    for (; i4[3] < out_sz; i4[3]++) {
	unsigned char c3 = D[l3].R[RansDecGet(&rans3, TF_SHIFT)];
	out_buf[i4[3]] = c3;
	RansDecAdvanceSymbol(&rans3, &ptr, &syms[l3][c3], TF_SHIFT);
	l3 = c3;
    }

    *out_size = out_sz;

    for (i = 0; i < 256; i++)
	if (D[i].R) free(D[i].R);

    return (unsigned char *)out_buf;
}